

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall
BVSparse<Memory::HeapAllocator>::Clear(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  BVSparseNode *pBVar1;
  Type_conflict *local_28;
  Type_conflict *prevNextField;
  
  local_28 = (Type_conflict *)0x0;
  pBVar1 = NodeFromIndex(this,i,&local_28,false);
  if (pBVar1 != (BVSparseNode *)0x0) {
    BVUnitT<unsigned_long>::Clear(&pBVar1->data,i & 0x3f);
    if ((pBVar1->data).word == 0) {
      pBVar1 = DeleteNode(this,pBVar1,false);
      *local_28 = pBVar1;
    }
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::Clear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if(current)
    {
        current->data.Clear(SparseBVUnit::Offset(i));
        if (current->data.IsEmpty())
        {
            *prevNextField = this->DeleteNode(current, false);
        }
    }
}